

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

void __thiscall CaDiCaL::Terminal::color(Terminal *this,int color,bool bright)

{
  byte in_DL;
  uint in_ESI;
  undefined8 *in_RDI;
  char local_19;
  
  if ((*(byte *)((long)in_RDI + 9) & 1) != 0) {
    escape((Terminal *)0xdd2571);
    local_19 = '1';
    if ((in_DL & 1) == 0) {
      local_19 = '0';
    }
    fputc((int)local_19,(FILE *)*in_RDI);
    fprintf((FILE *)*in_RDI,";%dm",(ulong)in_ESI);
    fflush((FILE *)*in_RDI);
  }
  return;
}

Assistant:

void color (int color, bool bright) {
    if (!use_colors)
      return;
    assert (connected);
    escape ();
    fputc (bright ? '1' : '0', file);
    fprintf (file, ";%dm", color);
    fflush (file);
  }